

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O2

uint8_t EBML_CodedValueLength
                  (filepos_t Length,size_t CodedSize,uint8_t *OutBuffer,bool_t bSizeIsFinite)

{
  uint uVar1;
  byte *pbVar2;
  ulong uVar3;
  filepos_t fVar4;
  
  fVar4 = 0x7fffffffffffffff;
  if (bSizeIsFinite != 0) {
    fVar4 = Length;
  }
  *OutBuffer = (uint8_t)(1 << (8 - (uint8_t)CodedSize & 0x1f));
  pbVar2 = OutBuffer + CodedSize;
  uVar1 = 0xff;
  for (uVar3 = 1; pbVar2 = pbVar2 + -1, uVar3 < CodedSize; uVar3 = uVar3 + 1) {
    *pbVar2 = (byte)fVar4;
    fVar4 = fVar4 >> 8;
    uVar1 = uVar1 >> 1;
  }
  *OutBuffer = *OutBuffer | (byte)fVar4 & (byte)uVar1;
  return (uint8_t)CodedSize;
}

Assistant:

uint8_t EBML_CodedValueLength(filepos_t Length, size_t CodedSize, uint8_t *OutBuffer, bool_t bSizeIsFinite)
{
    int _SizeMask = 0xFF;
    size_t i;
#if 0
if (CodedSize==3)
printf("%08X ",(int)Length);
#endif
    if (!bSizeIsFinite)
        Length=MAX_FILEPOS;
    OutBuffer[0] = (uint8_t)(1 << (8 - CodedSize));
    for (i=1; i<CodedSize; ++i)
    {
        OutBuffer[CodedSize-i] = (uint8_t)(Length & 0xFF);
        Length >>= 8;
        _SizeMask >>= 1;
    }
    // first one use a OR with the "EBML size head"
    OutBuffer[0] |= Length & 0xFF & _SizeMask;
#if 0
if (CodedSize==3)
printf("%02X%02X%02X\n",OutBuffer[0],OutBuffer[1],OutBuffer[2]);
#endif
    return (uint8_t)CodedSize;
}